

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QPageSize * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QPageSize *pQVar5;
  const_iterator o;
  QPageSize *in_RSI;
  QPageSize *in_RDI;
  long in_FS_OFFSET;
  QPageSize *ps_1;
  add_const_t<QList<QPageSize>_> *__range2_1;
  QPageSize *ps;
  add_const_t<QList<QPageSize>_> *__range2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  QString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  bool local_c1;
  QPlatformPrintDevice *in_stack_ffffffffffffff58;
  const_iterator local_58 [7];
  QPageSize *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QPageSize::isValid();
  if ((uVar4 & 1) == 0) {
    QPageSize::QPageSize(in_RDI);
  }
  else {
    if (((byte)in_RSI[0x6b] & 1) == 0) {
      (**(code **)(*(long *)in_RSI + 0x130))();
    }
    iVar2 = QPageSize::id();
    if (iVar2 != 0x1f) {
      local_10.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
      local_10 = QList<QPageSize>::begin
                           ((QList<QPageSize> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_18.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
      local_18 = QList<QPageSize>::end
                           ((QList<QPageSize> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      while( true ) {
        local_20 = local_18.i;
        bVar1 = QList<QPageSize>::const_iterator::operator!=(&local_10,local_18);
        if (!bVar1) break;
        pQVar5 = QList<QPageSize>::const_iterator::operator*(&local_10);
        iVar2 = QPageSize::id();
        iVar3 = QPageSize::id();
        local_c1 = false;
        if (iVar2 == iVar3) {
          QPageSize::name();
          QPageSize::name();
          local_c1 = ::operator==((QString *)
                                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                  in_stack_ffffffffffffff28);
        }
        in_stack_ffffffffffffff34 = CONCAT13(local_c1,(int3)in_stack_ffffffffffffff34);
        if (iVar2 == iVar3) {
          QString::~QString((QString *)0x131e20);
          QString::~QString((QString *)0x131e36);
        }
        if ((in_stack_ffffffffffffff34 & 0x1000000) != 0) {
          QPageSize::QPageSize(in_RDI,pQVar5);
          goto LAB_00131f76;
        }
        QList<QPageSize>::const_iterator::operator++(&local_10);
      }
    }
    iVar2 = QPageSize::id();
    if (iVar2 != 0x1f) {
      local_58[0].i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
      local_58[0] = QList<QPageSize>::begin
                              ((QList<QPageSize> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      o = QList<QPageSize>::end
                    ((QList<QPageSize> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      while (bVar1 = QList<QPageSize>::const_iterator::operator!=(local_58,o), bVar1) {
        in_stack_ffffffffffffff58 =
             (QPlatformPrintDevice *)QList<QPageSize>::const_iterator::operator*(local_58);
        iVar2 = QPageSize::id();
        iVar3 = QPageSize::id();
        if (iVar2 == iVar3) {
          QPageSize::QPageSize(in_RDI,(QPageSize *)in_stack_ffffffffffffff58);
          goto LAB_00131f76;
        }
        QList<QPageSize>::const_iterator::operator++(local_58);
      }
    }
    supportedPageSizeMatch(in_stack_ffffffffffffff58,in_RSI);
  }
LAB_00131f76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QPageSize &pageSize) const
{
    if (!pageSize.isValid())
        return QPageSize();

    if (!m_havePageSizes)
        loadPageSizes();

    // First try match on name and id for case where printer defines same size twice with different names
    // e.g. Windows defines DMPAPER_11X17 and DMPAPER_TABLOID with names "11x17" and "Tabloid", but both
    // map to QPageSize::Tabloid / PPD Key "Tabloid" / ANSI B Tabloid
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id() && ps.name() == pageSize.name())
                return ps;
        }
    }

    // Next try match on id only if not custom
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id())
                return ps;
        }
    }

    // Next try a match on size, in case it's a custom with a different name
    return supportedPageSizeMatch(pageSize);
}